

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::And
          (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this,
          HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *this2)

{
  int iVar1;
  SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *this_00;
  Type *pTVar6;
  NodeBase *pNVar7;
  undefined1 local_70 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pNVar7 = (NodeBase *)0x0;
  do {
    if ((NodeBase *)(ulong)this->tableSize <= pNVar7) {
      return;
    }
    iter2.list = this2->table + (long)pNVar7;
    iter.last = pNVar7;
    local_40 = (undefined1  [8])iter2.list;
    if (iter2.list ==
        (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
LAB_003d76d0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    pSVar2 = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
             ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0
    ;
    if ((undefined1  [8])pSVar2 != local_40) {
      iter2.list = pSVar2;
    }
    local_70 = (undefined1  [8])(this->table + (long)pNVar7);
    iter.super_Iterator.current = (NodeBase *)0x0;
    iter.super_Iterator.list =
         (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)local_70;
LAB_003d74e5:
    bVar4 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_70);
    if (bVar4) {
      this_00 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)local_70);
      while (((iter2.list !=
               (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0
              && ((undefined1  [8])iter2.list != local_40)) &&
             (iVar1 = this_00->value,
             pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)local_40), iVar1 < pTVar6->value))) {
        if (iter2.list ==
            (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) goto LAB_003d76d0;
          *puVar5 = 0;
        }
        pSVar2 = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                 ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *
                     )0x0;
        if ((undefined1  [8])pSVar2 != local_40) {
          iter2.list = pSVar2;
        }
      }
      if (((iter2.list !=
            (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
          ((undefined1  [8])iter2.list != local_40)) &&
         (iVar1 = this_00->value,
         pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)local_40), iVar1 == pTVar6->value)) {
        pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)local_40);
        bVar4 = AddPropertyCacheBucket::operator!=(&this_00->element,&pTVar6->element);
        if (!bVar4) {
          iVar1 = this_00->value;
          pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          if (iVar1 == pTVar6->value) {
            pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40);
            bVar4 = AddPropertyCacheBucket::operator==(&this_00->element,&pTVar6->element);
            if (!bVar4) goto LAB_003d7611;
          }
          else {
LAB_003d7611:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/HashTable.h"
                               ,0x108,
                               "(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element)"
                               ,"Huh??");
            if (!bVar4) goto LAB_003d76d0;
            *puVar5 = 0;
          }
          if (iter2.list ==
              (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003d76d0;
            *puVar5 = 0;
          }
          pSVar2 = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
          goto LAB_003d74e5;
        }
      }
      SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
      ::RemoveCurrent((EditingIterator *)local_70,this->alloc);
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Remove(this->stats,false);
      }
      goto LAB_003d74e5;
    }
    pNVar7 = (NodeBase *)((long)&(iter.last)->next + 1);
  } while( true );
}

Assistant:

void And(HashTable<T> *this2)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<Bucket<T>>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    iter2.Next();
                }

                if (!iter2.IsValid() || bucket.value != iter2.Data().value || bucket.element != iter2.Data().element)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(false);
#endif
                    continue;
                }
                else
                {
                    AssertMsg(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element, "Huh??");
                }
                iter2.Next();
            } NEXT_SLISTBASE_ENTRY_EDITING;
        }
    }